

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  string local_190 [32];
  string local_170 [32];
  long local_150;
  size_t pos;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  Token local_c8;
  string local_a0 [32];
  Token local_80;
  undefined1 local_48 [8];
  Token token;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_local;
  string *arg_local;
  Parser *this_local;
  
  token._32_8_ = tokens;
  while (bVar1 = std::__cxx11::string::empty(), ((bVar1 ^ 0xff) & 1) != 0) {
    Token::Token((Token *)local_48,Positional,arg);
    std::__cxx11::string::operator=((string *)arg,"");
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&token);
    if (*pcVar2 == '-') {
      uVar3 = std::__cxx11::string::size();
      if ((uVar3 < 2) ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&token), *pcVar2 != '-')) {
        std::__cxx11::string::substr((ulong)local_e8,(ulong)&token);
        Token::Token(&local_c8,ShortOpt,local_e8);
        Token::operator=((Token *)local_48,&local_c8);
        Token::~Token(&local_c8);
        std::__cxx11::string::~string((string *)local_e8);
        uVar3 = std::__cxx11::string::size();
        if (1 < uVar3) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&token);
          lVar4 = std::__cxx11::string::find((char)this,(ulong)(uint)(int)*pcVar2);
          if (lVar4 == -1) {
            std::__cxx11::string::substr((ulong)local_128,(ulong)&token);
            std::operator+((char *)local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x252760);
            std::__cxx11::string::operator=((string *)arg,local_108);
            std::__cxx11::string::~string(local_108);
            std::__cxx11::string::~string(local_128);
            std::__cxx11::string::substr((ulong)&pos,(ulong)&token);
            std::__cxx11::string::operator=((string *)&token,(string *)&pos);
            std::__cxx11::string::~string((string *)&pos);
          }
        }
      }
      else {
        std::__cxx11::string::substr((ulong)local_a0,(ulong)&token);
        Token::Token(&local_80,LongOpt,local_a0);
        Token::operator=((Token *)local_48,&local_80);
        Token::~Token(&local_80);
        std::__cxx11::string::~string((string *)local_a0);
      }
    }
    if ((local_48._0_4_ != Positional) &&
       (local_150 = std::__cxx11::string::find_first_of((string *)&token,(ulong)this),
       local_150 != -1)) {
      std::__cxx11::string::substr((ulong)local_170,(ulong)&token);
      std::__cxx11::string::operator=((string *)arg,local_170);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::substr((ulong)local_190,(ulong)&token);
      std::__cxx11::string::operator=((string *)&token,local_190);
      std::__cxx11::string::~string(local_190);
    }
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    push_back((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
              token._32_8_,(value_type *)local_48);
    Token::~Token((Token *)local_48);
  }
  return;
}

Assistant:

void parseIntoTokens( std::string arg, std::vector<Parser::Token>& tokens ) const {
            while( !arg.empty() ) {
                Parser::Token token( Parser::Token::Positional, arg );
                arg = "";
                if( token.data[0] == '-' ) {
                    if( token.data.size() > 1 && token.data[1] == '-' ) {
                        token = Parser::Token( Parser::Token::LongOpt, token.data.substr( 2 ) );
                    }
                    else {
                        token = Parser::Token( Parser::Token::ShortOpt, token.data.substr( 1 ) );
                        if( token.data.size() > 1 && separators.find( token.data[1] ) == std::string::npos ) {
                            arg = "-" + token.data.substr( 1 );
                            token.data = token.data.substr( 0, 1 );
                        }
                    }
                }
                if( token.type != Parser::Token::Positional ) {
                    std::size_t pos = token.data.find_first_of( separators );
                    if( pos != std::string::npos ) {
                        arg = token.data.substr( pos+1 );
                        token.data = token.data.substr( 0, pos );
                    }
                }
                tokens.push_back( token );
            }
        }